

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

ON_RTreeNode * __thiscall ON_RTreeMemPool::AllocNode(ON_RTreeMemPool *this)

{
  ON_RTreeNode *pOVar1;
  
  pOVar1 = (ON_RTreeNode *)this->m_nodes;
  if (pOVar1 == (ON_RTreeNode *)0x0) {
    if (this->m_buffer_capacity < 0x158) {
      GrowBuffer(this);
    }
    pOVar1 = (ON_RTreeNode *)this->m_buffer;
    if (pOVar1 == (ON_RTreeNode *)0x0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
                 ,0xf2,"","ON_RTreeMemPool::AllocNode() - out of memory");
      return (ON_RTreeNode *)0x0;
    }
    this->m_buffer = (uchar *)(pOVar1 + 1);
    this->m_buffer_capacity = this->m_buffer_capacity - 0x158;
  }
  else {
    this->m_nodes = *(Blk **)pOVar1;
  }
  pOVar1->m_level = -1;
  pOVar1->m_count = 0;
  return pOVar1;
}

Assistant:

ON_RTreeNode* ON_RTreeMemPool::AllocNode()
{
  ON_RTreeNode* node = (ON_RTreeNode*)m_nodes;
  if ( node )
  {
    m_nodes = m_nodes->m_next;
  }
  else
  {
    const size_t node_sz = sizeof(*node);
    if ( m_buffer_capacity < node_sz )
      GrowBuffer();

    if ( 0 == (node = (ON_RTreeNode*)m_buffer) )
    {
      ON_ERROR("ON_RTreeMemPool::AllocNode() - out of memory");
      return 0;
    }

    m_buffer += node_sz;
    m_buffer_capacity -= node_sz;
  }

  // initialize node
  node->m_count = 0;
  node->m_level = -1;

  return node;
}